

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm *
sqlite3WhereFindTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  undefined1 local_b8 [8];
  WhereScan scan;
  WhereTerm *p;
  WhereTerm *pResult;
  Index *pIdx_local;
  u32 op_local;
  Bitmask notReady_local;
  int iColumn_local;
  int iCur_local;
  WhereClause *pWC_local;
  
  p = (WhereTerm *)0x0;
  scan._104_8_ = whereScanInit((WhereScan *)local_b8,pWC,iCur,iColumn,op,pIdx);
  do {
    if (scan._104_8_ == 0) {
      return p;
    }
    if ((*(ulong *)(scan._104_8_ + 0x30) & notReady) == 0) {
      if ((*(long *)(scan._104_8_ + 0x30) == 0) &&
         (((uint)*(ushort *)(scan._104_8_ + 0x14) & op & 0x82) != 0)) {
        return (WhereTerm *)scan._104_8_;
      }
      if (p == (WhereTerm *)0x0) {
        p = (WhereTerm *)scan._104_8_;
      }
    }
    scan._104_8_ = whereScanNext((WhereScan *)local_b8);
  } while( true );
}

Assistant:

SQLITE_PRIVATE WhereTerm *sqlite3WhereFindTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pResult = 0;
  WhereTerm *p;
  WhereScan scan;

  p = whereScanInit(&scan, pWC, iCur, iColumn, op, pIdx);
  op &= WO_EQ|WO_IS;
  while( p ){
    if( (p->prereqRight & notReady)==0 ){
      if( p->prereqRight==0 && (p->eOperator&op)!=0 ){
        testcase( p->eOperator & WO_IS );
        return p;
      }
      if( pResult==0 ) pResult = p;
    }
    p = whereScanNext(&scan);
  }
  return pResult;
}